

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall MobileElementManager::MobileElementManager(MobileElementManager *this)

{
  MobileElementManager *this_local;
  
  this->prop_sum_ = 0.0;
  this->pol_count_ = 0;
  std::vector<double,_std::allocator<double>_>::vector(&this->prop_list_);
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::vector(&this->polymerases_);
  std::__cxx11::string::string((string *)&this->seq_);
  std::vector<double,_std::allocator<double>_>::vector(&this->weights_);
  return;
}

Assistant:

MobileElementManager::MobileElementManager() {}